

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int make_var_dead(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  VARR_live_range_t *varr;
  int iVar1;
  live_range_t_conflict plVar2;
  live_range_t_conflict lr;
  int insn_p_local;
  int point_local;
  int scan_var_local;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  if ((insn_p != 0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
    bitmap_set_bit_p(gen_ctx->lr_ctx->referenced_vars,(ulong)var);
  }
  plVar2 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(ulong)var);
  iVar1 = bitmap_clear_bit_p(gen_ctx->lr_ctx->live_vars,(long)scan_var);
  if (iVar1 == 0) {
    varr = gen_ctx->lr_ctx->var_live_ranges;
    plVar2 = create_live_range(gen_ctx,point,point,plVar2);
    VARR_live_range_tset(varr,(ulong)var,plVar2);
  }
  else {
    plVar2->finish = point;
  }
  return 1;
}

Assistant:

static inline int make_var_dead (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (bitmap_clear_bit_p (live_vars, scan_var)) {
    lr->finish = point;
  } else {
    /* insn with unused result: result still needs a hard register */
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, point, lr));
  }
  return TRUE;
}